

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

HashErr insert_symbol(SymbolTable *s,char *name,SymbolInfo val)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Bucket *__ptr;
  char cVar5;
  int iVar6;
  ulong uVar7;
  Symbol *pSVar8;
  
  cVar1 = *name;
  if (cVar1 == '\0') {
    uVar7 = 0;
  }
  else {
    pcVar4 = name + 1;
    uVar7 = 0;
    cVar5 = cVar1;
    do {
      uVar7 = uVar7 + (long)cVar5;
      uVar7 = (uVar7 >> 2) + (long)cVar5 + uVar7 * 8;
      cVar5 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar5 != '\0');
    uVar7 = uVar7 % 0xfd;
  }
  __ptr = s->bucket[uVar7];
  iVar2 = __ptr->num_symbols;
  if (0 < iVar2) {
    pSVar8 = __ptr->symbol;
    iVar6 = iVar2 + 1;
    do {
      if ((cVar1 == *pSVar8->name) && (iVar3 = strcmp(name,pSVar8->name), iVar3 == 0)) {
        return HASH_DUPLICATE;
      }
      pSVar8 = pSVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  iVar6 = __ptr->max_symbols;
  if (iVar6 <= iVar2) {
    __ptr->max_symbols = iVar6 * 2;
    __ptr = (Bucket *)realloc(__ptr,(long)iVar6 << 5 | 8);
    s->bucket[uVar7] = __ptr;
  }
  iVar2 = __ptr->num_symbols;
  __ptr->num_symbols = iVar2 + 1;
  __ptr->symbol[iVar2].name = name;
  __ptr->symbol[iVar2].value = val;
  return HASH_NOERR;
}

Assistant:

HashErr
insert_symbol (SymbolTable *s, const char *name, SymbolInfo val)
{
  int i, bucket_num = hash_code (name);
  Symbol *sym;
  Bucket *b;
  char firstc = *name;

  b = s->bucket[bucket_num];
  
  /* First, check for a duplicate. */
  for (i = b->num_symbols, sym = &b->symbol[0]; i > 0; sym++, i--)
    if (firstc == sym->name[0] && !strcmp (name, sym->name))
      return HASH_DUPLICATE;

  /* If there isn't room, double the size of the bucket. */
  if (b->num_symbols >= b->max_symbols)
    {
      b->max_symbols *= 2;
      b = s->bucket[bucket_num] =
	(Bucket *) realloc (b, sizeof *b + ((b->max_symbols - INITIAL_SYMBOLS)
					    * sizeof (Symbol)));
    }

  sym = &b->symbol[b->num_symbols++];
  sym->name = name;
  sym->value = val;

  return HASH_NOERR;
}